

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O1

void ihevc_intra_pred_luma_planar
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar5 = nt << 0x1e | nt - 4U >> 2;
  bVar3 = 6;
  if (uVar5 < 4) {
    bVar3 = (byte)*(undefined4 *)(&DAT_001722a0 + (ulong)uVar5 * 4);
  }
  if (0 < nt) {
    uVar4 = (ulong)(uint)nt;
    uVar6 = (long)nt - 1;
    uVar2 = 0;
    do {
      uVar1 = uVar6 & 0xffffffff;
      uVar7 = 1;
      do {
        pu1_dst[uVar7 - 1] =
             (UWORD8)((int)((uint)pu1_ref[~uVar2 + uVar4 * 2] * (int)uVar1 + nt +
                            (uint)pu1_ref[uVar7 + uVar4 * 2] * ((int)uVar6 - (int)uVar2) +
                            (uint)pu1_ref[uVar4 * 3 + 1] * (int)uVar7 +
                           (uint)pu1_ref[uVar6] * ((int)uVar2 + 1)) >> (bVar3 & 0x1f));
        uVar1 = (ulong)((int)uVar1 - 1);
        bVar8 = uVar7 != uVar4;
        uVar7 = uVar7 + 1;
      } while (bVar8);
      uVar2 = uVar2 + 1;
      pu1_dst = pu1_dst + dst_strd;
    } while (uVar2 != uVar4);
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_planar(UWORD8 *pu1_ref,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_dst,
                                  WORD32 dst_strd,
                                  WORD32 nt,
                                  WORD32 mode)
{


    WORD32 row, col;
    WORD32 log2nt = 5;
    WORD32 two_nt, three_nt;
    UNUSED(src_strd);
    UNUSED(mode);
    switch(nt)
    {
        case 32:
            log2nt = 5;
            break;
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }
    two_nt = 2 * nt;
    three_nt = 3 * nt;
    /* Planar filtering */
    for(row = 0; row < nt; row++)
    {
        for(col = 0; col < nt; col++)
        {
            pu1_dst[row * dst_strd + col] = ((nt - 1 - col)
                            * pu1_ref[two_nt - 1 - row]
                            + (col + 1) * pu1_ref[three_nt + 1]
                            + (nt - 1 - row) * pu1_ref[two_nt + 1 + col]
                            + (row + 1) * pu1_ref[nt - 1] + nt) >> (log2nt + 1);
        }
    }
}